

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  long lVar1;
  SeekHead *pSVar2;
  bool bVar3;
  long lVar4;
  Entry *pEVar5;
  VoidElement *pVVar6;
  ulong uVar7;
  Entry *pEVar8;
  ulong uVar9;
  long unaff_R14;
  longlong idpos;
  long stop;
  longlong pos;
  longlong size;
  longlong id;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  IMkvReader *local_48;
  long local_40;
  SeekHead *local_38;
  
  local_48 = this->m_pSegment->m_pReader;
  local_68 = this->m_start;
  stop = local_68 + this->m_size;
  local_50 = 0;
  local_60 = 0;
  local_38 = this;
  while (pSVar2 = local_38, local_68 < stop) {
    lVar4 = ParseElementHeader(local_48,&local_68,stop,&local_40,&local_58);
    if (lVar4 < 0) {
      bVar3 = false;
    }
    else if (local_40 == 0xec) {
      uVar7 = local_50 + 1;
      bVar3 = (long)local_50 < 0x7fffffff;
      local_50 = uVar7;
      if (bVar3) goto LAB_001554ea;
      lVar4 = -1;
      bVar3 = false;
    }
    else if ((local_40 == 0x4dbb) &&
            (uVar7 = local_60 + 1, bVar3 = 0x7ffffffe < (long)local_60, local_60 = uVar7, bVar3)) {
      bVar3 = false;
      lVar4 = -1;
    }
    else {
LAB_001554ea:
      local_68 = local_68 + local_58;
      bVar3 = local_68 <= stop;
      lVar4 = unaff_R14;
      if (stop < local_68) {
        lVar4 = -2;
      }
    }
    unaff_R14 = lVar4;
    if (!bVar3) {
      return lVar4;
    }
  }
  if (local_68 != stop) {
    return -2;
  }
  if ((long)local_60 < 1) {
LAB_0015558c:
    if (0 < (long)local_50) {
      pVVar6 = (VoidElement *)
               operator_new__(-(ulong)(local_50 >> 0x3c != 0) | local_50 << 4,
                              (nothrow_t *)&std::nothrow);
      pSVar2->m_void_elements = pVVar6;
      if (pVVar6 == (VoidElement *)0x0) goto LAB_001556b4;
    }
    local_68 = pSVar2->m_start;
    pEVar8 = pSVar2->m_entries;
    pVVar6 = pSVar2->m_void_elements;
    do {
      lVar1 = local_68;
      if (stop <= local_68) {
        if (local_68 != stop) {
          return -2;
        }
        local_38->m_entry_count = (int)((ulong)((long)pEVar8 - (long)local_38->m_entries) >> 5);
        local_38->m_void_element_count =
             (int)((ulong)((long)pVVar6 - (long)local_38->m_void_elements) >> 4);
        return 0;
      }
      lVar4 = ParseElementHeader(local_48,&local_68,stop,&local_40,&local_58);
      if (lVar4 < 0) {
        bVar3 = false;
      }
      else {
        if (local_40 == 0x4dbb && 0 < (long)local_60) {
          bVar3 = ParseEntry(local_48,local_68,local_58,pEVar8);
          if (bVar3) {
            pEVar8->element_start = lVar1;
            pEVar8->element_size = (local_68 - lVar1) + local_58;
            pEVar8 = pEVar8 + 1;
          }
        }
        else if (local_40 == 0xec && 0 < (long)local_50) {
          pVVar6->element_start = lVar1;
          pVVar6->element_size = (local_68 - lVar1) + local_58;
          pVVar6 = pVVar6 + 1;
        }
        local_68 = local_68 + local_58;
        bVar3 = local_68 <= stop;
        lVar4 = unaff_R14;
        if (stop < local_68) {
          lVar4 = -2;
        }
      }
      unaff_R14 = lVar4;
    } while (bVar3);
  }
  else {
    uVar7 = local_60 << 5;
    pEVar5 = (Entry *)operator_new__(-(ulong)(local_60 >> 0x3b != 0) | uVar7,
                                     (nothrow_t *)&std::nothrow);
    pEVar8 = (Entry *)0x0;
    if (pEVar5 != (Entry *)0x0) {
      uVar9 = 0;
      do {
        Entry::Entry((Entry *)((long)&pEVar5->id + uVar9));
        uVar9 = uVar9 + 0x20;
        pEVar8 = pEVar5;
      } while (uVar7 != uVar9);
    }
    pSVar2->m_entries = pEVar8;
    if (pEVar8 != (Entry *)0x0) goto LAB_0015558c;
LAB_001556b4:
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  long long entry_count = 0;
  long long void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek) {
      ++entry_count;
      if (entry_count > INT_MAX)
        return E_PARSE_FAILED;
    } else if (id == libwebm::kMkvVoid) {
      ++void_element_count;
      if (void_element_count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[static_cast<size_t>(entry_count)];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements =
        new (std::nothrow) VoidElement[static_cast<size_t>(void_element_count)];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(static_cast<long long>(count_) <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(static_cast<long long>(count_) <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}